

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.h
# Opt level: O2

clock_t __thiscall WaveformGenerator::clock(WaveformGenerator *this)

{
  uint uVar1;
  ulong in_RAX;
  uint uVar2;
  
  if (this->test == 0) {
    uVar1 = this->accumulator;
    uVar2 = this->freq + uVar1;
    this->accumulator = uVar2 & 0xffffff;
    this->msb_rising = (bool)((byte)(uVar2 >> 0x17) & (uVar1 >> 0x17 & 1) == 0);
    uVar1 = uVar1 >> 0x13 & 1;
    in_RAX = (ulong)uVar1;
    if ((uVar2 >> 0x13 & 1) != 0 && (char)uVar1 == '\0') {
      uVar1 = this->shift_register;
      uVar1 = ((uVar1 >> 0x11 ^ uVar1 >> 0x16) & 1) + (uVar1 & 0x3fffff) * 2;
      this->shift_register = uVar1;
      return (ulong)uVar1;
    }
  }
  return in_RAX;
}

Assistant:

RESID_INLINE
void WaveformGenerator::clock()
{
  // No operation if test bit is set.
  if (test) {
    return;
  }

  reg24 accumulator_prev = accumulator;

  // Calculate new accumulator value;
  accumulator += freq;
  accumulator &= 0xffffff;

  // Check whether the MSB is set high. This is used for synchronization.
  msb_rising = !(accumulator_prev & 0x800000) && (accumulator & 0x800000);

  // Shift noise register once for each time accumulator bit 19 is set high.
  if (!(accumulator_prev & 0x080000) && (accumulator & 0x080000)) {
    reg24 bit0 = ((shift_register >> 22) ^ (shift_register >> 17)) & 0x1;
    shift_register <<= 1;
    shift_register &= 0x7fffff;
    shift_register |= bit0;
  }
}